

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_predictor_8x4_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  uint uVar2;
  short sVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  unkuint9 Var12;
  undefined1 auVar13 [11];
  undefined1 auVar14 [13];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar19;
  ushort uVar20;
  undefined1 uVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  undefined2 uVar27;
  undefined2 uVar28;
  undefined1 auVar26 [16];
  uint uVar29;
  uint uVar32;
  uint uVar33;
  undefined1 auVar30 [16];
  uint uVar34;
  __m128i d;
  __m128i rep;
  uint uVar35;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar25 [16];
  undefined1 auVar31 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  auVar18 = _DAT_00515880;
  auVar17 = _DAT_00515870;
  auVar21 = pshuflw(ZEXT116(left[3]),ZEXT116(left[3]),0);
  uVar1 = *(ulong *)above;
  uVar23 = (undefined1)(uVar1 >> 0x38);
  auVar4._8_6_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xe] = uVar23;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[0xc] = (char)(uVar1 >> 0x30);
  auVar5._13_2_ = auVar4._13_2_;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._12_3_ = auVar5._12_3_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[10] = (char)(uVar1 >> 0x28);
  auVar7._11_4_ = auVar6._11_4_;
  auVar8._8_2_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8._10_5_ = auVar7._10_5_;
  auVar9[8] = (char)(uVar1 >> 0x20);
  auVar9._0_8_ = uVar1;
  auVar9._9_6_ = auVar8._9_6_;
  auVar11._7_8_ = 0;
  auVar11._0_7_ = auVar9._8_7_;
  Var12 = CONCAT81(SUB158(auVar11 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar15._9_6_ = 0;
  auVar15._0_9_ = Var12;
  auVar13._1_10_ = SUB1510(auVar15 << 0x30,5);
  auVar13[0] = (char)(uVar1 >> 0x10);
  auVar16._11_4_ = 0;
  auVar16._0_11_ = auVar13;
  auVar14._1_12_ = SUB1512(auVar16 << 0x20,3);
  auVar14[0] = (char)(uVar1 >> 8);
  uVar20 = CONCAT11(0,(byte)uVar1);
  auVar10._2_13_ = auVar14;
  auVar10._0_2_ = uVar20;
  uVar28 = auVar21._2_2_;
  auVar26._0_12_ = auVar10._0_12_;
  auVar26._12_2_ = (short)Var12;
  auVar26._14_2_ = uVar28;
  auVar25._12_4_ = auVar26._12_4_;
  auVar25._0_10_ = auVar10._0_10_;
  uVar27 = auVar21._0_2_;
  auVar25._10_2_ = uVar27;
  auVar24._10_6_ = auVar25._10_6_;
  auVar24._8_2_ = auVar13._0_2_;
  auVar24._6_2_ = uVar28;
  auVar24._4_2_ = auVar14._0_2_;
  auVar24._2_2_ = uVar27;
  auVar24._0_2_ = uVar20;
  auVar22._2_2_ = uVar27;
  auVar22._0_2_ = auVar9._8_2_;
  auVar22._4_2_ = auVar7._10_2_;
  auVar22._6_2_ = uVar28;
  auVar22._8_2_ = auVar5._12_2_;
  auVar22._10_2_ = uVar27;
  auVar22[0xc] = uVar23;
  auVar22[0xd] = 0;
  auVar22._14_2_ = uVar28;
  auVar26 = pshuflw(ZEXT116(above[7]),ZEXT116(above[7]),0);
  uVar2 = *(uint *)left;
  iVar19 = 4;
  auVar21 = _DAT_00515770;
  auVar25 = _DAT_004dab60;
  do {
    auVar40 = pshufb(_DAT_00515850,auVar21);
    auVar46 = pshufb(_DAT_00515860,auVar21);
    auVar44._0_12_ = auVar40._0_12_;
    auVar44._12_2_ = auVar40._6_2_;
    auVar44._14_2_ = auVar46._6_2_;
    auVar43._12_4_ = auVar44._12_4_;
    auVar43._0_10_ = auVar40._0_10_;
    auVar43._10_2_ = auVar46._4_2_;
    auVar42._10_6_ = auVar43._10_6_;
    auVar42._0_8_ = auVar40._0_8_;
    auVar42._8_2_ = auVar40._4_2_;
    auVar41._8_8_ = auVar42._8_8_;
    auVar41._6_2_ = auVar46._2_2_;
    auVar41._4_2_ = auVar40._2_2_;
    auVar41._0_2_ = auVar40._0_2_;
    auVar41._2_2_ = auVar46._0_2_;
    auVar47 = pmaddwd(auVar24,auVar41);
    auVar40 = pshufb(ZEXT416(uVar2),auVar25);
    auVar45._0_12_ = auVar40._0_12_;
    auVar45._12_2_ = auVar40._6_2_;
    auVar45._14_2_ = auVar26._2_2_;
    auVar31._12_4_ = auVar45._12_4_;
    auVar31._0_10_ = auVar40._0_10_;
    auVar31._10_2_ = auVar26._0_2_;
    auVar30._10_6_ = auVar31._10_6_;
    auVar30._0_8_ = auVar40._0_8_;
    auVar30._8_2_ = auVar40._4_2_;
    auVar46._8_8_ = auVar30._8_8_;
    auVar46._6_2_ = auVar26._2_2_;
    auVar46._4_2_ = auVar40._2_2_;
    auVar46._0_2_ = auVar40._0_2_;
    auVar46._2_2_ = auVar26._0_2_;
    auVar40 = pmaddwd(auVar46,auVar17);
    uVar35 = auVar40._0_4_ + 0x100 + auVar47._0_4_;
    uVar37 = auVar40._4_4_ + 0x100 + auVar47._4_4_;
    uVar38 = auVar40._8_4_ + 0x100 + auVar47._8_4_;
    uVar39 = auVar40._12_4_ + 0x100 + auVar47._12_4_;
    auVar45 = pmaddwd(auVar41,auVar22);
    auVar40 = pmaddwd(auVar46,auVar18);
    uVar29 = auVar40._0_4_ + 0x100 + auVar45._0_4_;
    uVar32 = auVar40._4_4_ + 0x100 + auVar45._4_4_;
    uVar33 = auVar40._8_4_ + 0x100 + auVar45._8_4_;
    uVar34 = auVar40._12_4_ + 0x100 + auVar45._12_4_;
    sVar3 = (short)(uVar35 >> 9);
    uVar20 = (ushort)(uVar35 >> 0x19);
    auVar36[1] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar35 >> 0x19) - (0xff < uVar20);
    auVar36[0] = (0 < sVar3) * (sVar3 < 0x100) * (char)(uVar35 >> 9) - (0xff < sVar3);
    sVar3 = (short)(uVar37 >> 9);
    auVar36[2] = (0 < sVar3) * (sVar3 < 0x100) * (char)(uVar37 >> 9) - (0xff < sVar3);
    uVar20 = (ushort)(uVar37 >> 0x19);
    auVar36[3] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar37 >> 0x19) - (0xff < uVar20);
    sVar3 = (short)(uVar38 >> 9);
    auVar36[4] = (0 < sVar3) * (sVar3 < 0x100) * (char)(uVar38 >> 9) - (0xff < sVar3);
    uVar20 = (ushort)(uVar38 >> 0x19);
    auVar36[5] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar38 >> 0x19) - (0xff < uVar20);
    sVar3 = (short)(uVar39 >> 9);
    auVar36[6] = (0 < sVar3) * (sVar3 < 0x100) * (char)(uVar39 >> 9) - (0xff < sVar3);
    uVar20 = (ushort)(uVar39 >> 0x19);
    auVar36[7] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar39 >> 0x19) - (0xff < uVar20);
    sVar3 = (short)(uVar29 >> 9);
    auVar36[8] = (0 < sVar3) * (sVar3 < 0x100) * (char)(uVar29 >> 9) - (0xff < sVar3);
    uVar20 = (ushort)(uVar29 >> 0x19);
    auVar36[9] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar29 >> 0x19) - (0xff < uVar20);
    sVar3 = (short)(uVar32 >> 9);
    auVar36[10] = (0 < sVar3) * (sVar3 < 0x100) * (char)(uVar32 >> 9) - (0xff < sVar3);
    uVar20 = (ushort)(uVar32 >> 0x19);
    auVar36[0xb] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar32 >> 0x19) - (0xff < uVar20);
    sVar3 = (short)(uVar33 >> 9);
    auVar36[0xc] = (0 < sVar3) * (sVar3 < 0x100) * (char)(uVar33 >> 9) - (0xff < sVar3);
    uVar20 = (ushort)(uVar33 >> 0x19);
    auVar36[0xd] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar33 >> 0x19) - (0xff < uVar20);
    sVar3 = (short)(uVar34 >> 9);
    auVar36[0xe] = (0 < sVar3) * (sVar3 < 0x100) * (char)(uVar34 >> 9) - (0xff < sVar3);
    uVar20 = (ushort)(uVar34 >> 0x19);
    auVar36[0xf] = (uVar20 != 0) * (uVar20 < 0x100) * (byte)(uVar34 >> 0x19) - (0xff < uVar20);
    auVar40 = pshufb(auVar36,ZEXT816(0xe0c0a0806040200));
    *(long *)dst = auVar40._0_8_;
    dst = dst + stride;
    auVar47._0_2_ = auVar25._0_2_ + 1;
    auVar47._2_2_ = auVar25._2_2_ + 1;
    auVar47._4_2_ = auVar25._4_2_ + 1;
    auVar47._6_2_ = auVar25._6_2_ + 1;
    auVar47._8_2_ = auVar25._8_2_ + 1;
    auVar47._10_2_ = auVar25._10_2_ + 1;
    auVar47._12_2_ = auVar25._12_2_ + 1;
    auVar47._14_2_ = auVar25._14_2_ + 1;
    auVar40._0_2_ = auVar21._0_2_ + 0x202;
    auVar40._2_2_ = auVar21._2_2_ + 0x202;
    auVar40._4_2_ = auVar21._4_2_ + 0x202;
    auVar40._6_2_ = auVar21._6_2_ + 0x202;
    auVar40._8_2_ = auVar21._8_2_ + 0x202;
    auVar40._10_2_ = auVar21._10_2_ + 0x202;
    auVar40._12_2_ = auVar21._12_2_ + 0x202;
    auVar40._14_2_ = auVar21._14_2_ + 0x202;
    iVar19 = iVar19 + -1;
    auVar21 = auVar40;
    auVar25 = auVar47;
  } while (iVar19 != 0);
  return;
}

Assistant:

static inline void load_pixel_w8(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  __m128i d = _mm_loadl_epi64((const __m128i *)above);
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
  pixels[1] = _mm_unpackhi_epi16(d, bp);

  pixels[3] = _mm_set1_epi16((int16_t)above[7]);

  if (height == 4) {
    pixels[2] = _mm_cvtsi32_si128(((const int *)left)[0]);
  } else if (height == 8) {
    pixels[2] = _mm_loadl_epi64((const __m128i *)left);
  } else if (height == 16) {
    pixels[2] = _mm_load_si128((const __m128i *)left);
  } else {
    pixels[2] = _mm_load_si128((const __m128i *)left);
    pixels[4] = pixels[0];
    pixels[5] = pixels[1];
    pixels[6] = _mm_load_si128((const __m128i *)(left + 16));
    pixels[7] = pixels[3];
  }
}